

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.h
# Opt level: O2

void __thiscall
argParserAdvancedConfiguration::argument::argument
          (argument *this,string *argS,string *argL,string *helpMessage,function<void_()> *lambda_)

{
  allocator local_39;
  string *local_38;
  
  std::__cxx11::string::string((string *)this,(string *)argS);
  local_38 = &this->argLong;
  std::__cxx11::string::string((string *)local_38,(string *)argL);
  std::__cxx11::string::string((string *)&this->helpMessage,(string *)helpMessage);
  std::__cxx11::string::string((string *)&this->additionalHelp,"",&local_39);
  (this->enums)._M_dataplus._M_p = (pointer)&(this->enums).field_2;
  (this->enums)._M_string_length = 0;
  (this->enums).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->callBack).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callBack).super__Function_base._M_functor + 8) = 0;
  (this->callBack).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callBack)._M_invoker = (_Invoker_type)0x0;
  std::function<void_()>::function(&this->simpleCallBack,lambda_);
  this->requiredAndNotHitJet = false;
  this->numberOfArguments = -1;
  return;
}

Assistant:

argument(string argS, string argL, string helpMessage, function<void()> lambda_) : argLong(
                std::move(argL)), argShort(std::move(argS)), simpleCallBack(lambda_), helpMessage(
                std::move(helpMessage)) {}